

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcFault.c
# Opt level: O3

void Cnf_AddCardinConstrGeneral(sat_solver *p,Vec_Int_t *vVars,int K,int fStrict)

{
  sat_solver *psVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  undefined4 extraout_var;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  uint uVar11;
  int Lit;
  uint local_bc;
  uint local_b8;
  uint local_b4;
  sat_solver *local_b0;
  ulong local_a8;
  ulong local_a0;
  uint local_94;
  Vec_Int_t *local_90;
  ulong local_88;
  ulong local_80;
  int local_78;
  int local_74;
  ulong local_70;
  long local_68;
  ulong local_60;
  long local_58;
  ulong local_50;
  long local_48;
  ulong local_40;
  ulong local_38;
  
  local_78 = fStrict;
  local_74 = K;
  iVar2 = sat_solver_nvars(p);
  local_70 = CONCAT44(extraout_var,iVar2);
  iVar3 = vVars->nSize;
  uVar9 = (ulong)iVar3;
  local_b0 = p;
  if ((long)uVar9 < 1) {
    sat_solver_setnvars(p,iVar3 * iVar3 + iVar2);
  }
  else {
    uVar6 = 0;
    do {
      if ((vVars->pArray[uVar6] < 0) || (iVar2 <= vVars->pArray[uVar6])) {
        __assert_fail("iVar >= 0 && iVar < nVars",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bmc/bmcFault.c"
                      ,0xad,"void Cnf_AddCardinConstrGeneral(sat_solver *, Vec_Int_t *, int, int)");
      }
      uVar6 = uVar6 + 1;
    } while (uVar9 != uVar6);
    local_90 = vVars;
    sat_solver_setnvars(p,iVar3 * iVar3 + iVar2);
    if (0 < iVar3) {
      uVar6 = (ulong)(iVar3 - 1);
      local_48 = (long)(int)local_70;
      local_80 = (ulong)(uint)((int)local_70 - iVar3);
      uVar8 = 0;
      uVar10 = local_70 & 0xffffffff;
      local_94 = 0;
      local_88 = uVar6;
      local_40 = uVar9;
      do {
        psVar1 = local_b0;
        local_68 = (uVar8 - 1) * uVar9 + local_48;
        local_58 = uVar8 * uVar9 + local_48;
        uVar7 = (ulong)((uint)uVar8 & 1);
        local_a8 = uVar8;
        local_60 = uVar10;
        if ((uVar8 & 1) != 0) {
          uVar11 = (uint)local_68;
          if (uVar8 == 0) {
            if (local_90->nSize < 1) goto LAB_00537e00;
            uVar11 = *local_90->pArray;
          }
          local_a0 = uVar7;
          if ((int)((uint)local_58 | uVar11) < 0) goto LAB_00537e3e;
          uVar5 = (uint)local_58 * 2;
          local_b8 = uVar11 * 2 + 1;
          local_bc = uVar5;
          iVar3 = sat_solver_addclause(local_b0,(lit *)&local_bc,(lit *)&local_b4);
          uVar6 = local_88;
          uVar7 = local_a0;
          if (iVar3 != 0) {
            local_b8 = uVar11 * 2;
            local_bc = uVar5 | 1;
            sat_solver_addclause(psVar1,(lit *)&local_bc,(lit *)&local_b4);
            uVar6 = local_88;
            uVar7 = local_a0;
          }
        }
        iVar3 = (int)local_60;
        if ((int)uVar7 + 1 < (int)uVar9) {
          uVar7 = (ulong)(local_94 & 1);
          uVar11 = (iVar3 + (local_94 & 1)) * 2;
          do {
            psVar1 = local_b0;
            local_38 = uVar7 + 1;
            local_a0 = uVar7;
            if (local_a8 == 0) {
              if (((long)local_90->nSize <= (long)uVar7) || (local_90->nSize <= (int)local_38))
              goto LAB_00537e00;
              iVar3 = local_90->pArray[uVar7];
              iVar2 = local_90->pArray[local_38 & 0xffffffff];
            }
            else {
              iVar3 = (int)local_80 + (int)uVar7;
              iVar2 = (int)local_80 + (int)uVar7 + 1;
            }
            local_b8 = iVar3 * 2 + 1;
            local_bc = uVar11;
            iVar4 = sat_solver_addclause(local_b0,(lit *)&local_bc,(lit *)&local_b4);
            if (iVar4 == 0) {
LAB_00537dc2:
              __assert_fail("Cid",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satSolver.h"
                            ,0x16b,
                            "int sat_solver_add_and(sat_solver *, int, int, int, int, int, int)");
            }
            local_b8 = iVar2 * 2 + 1;
            local_bc = uVar11;
            iVar4 = sat_solver_addclause(psVar1,(lit *)&local_bc,(lit *)&local_b4);
            if (iVar4 == 0) {
LAB_00537de1:
              __assert_fail("Cid",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satSolver.h"
                            ,0x170,
                            "int sat_solver_add_and(sat_solver *, int, int, int, int, int, int)");
            }
            local_b8 = iVar3 * 2;
            local_b4 = iVar2 * 2;
            local_bc = uVar11 + 1;
            local_50 = (ulong)uVar11;
            iVar3 = sat_solver_addclause(psVar1,(lit *)&local_bc,(lit *)&local_b0);
            if (iVar3 == 0) {
LAB_00537da3:
              __assert_fail("Cid",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satSolver.h"
                            ,0x176,
                            "int sat_solver_add_and(sat_solver *, int, int, int, int, int, int)");
            }
            if (local_a8 == 0) {
              if (((long)local_90->nSize <= (long)local_a0) || (local_90->nSize <= (int)local_38))
              goto LAB_00537e00;
              iVar3 = local_90->pArray[local_a0];
              iVar2 = local_90->pArray[local_38 & 0xffffffff];
            }
            else {
              iVar3 = (int)local_80 + (int)local_a0;
              iVar2 = (int)local_80 + (int)local_a0 + 1;
            }
            uVar11 = (int)local_50 + 3;
            local_bc = uVar11;
            local_b8 = iVar3 * 2;
            iVar4 = sat_solver_addclause(psVar1,(lit *)&local_bc,(lit *)&local_b4);
            if (iVar4 == 0) goto LAB_00537dc2;
            local_bc = uVar11;
            local_b8 = iVar2 * 2;
            iVar4 = sat_solver_addclause(psVar1,(lit *)&local_bc,(lit *)&local_b4);
            if (iVar4 == 0) goto LAB_00537de1;
            iVar4 = (int)local_50;
            local_bc = iVar4 + 2;
            local_b8 = iVar3 * 2 | 1;
            local_b4 = iVar2 * 2 | 1;
            iVar3 = sat_solver_addclause(psVar1,(lit *)&local_bc,(lit *)&local_b0);
            if (iVar3 == 0) goto LAB_00537da3;
            uVar7 = local_a0 + 2;
            uVar11 = iVar4 + 4;
          } while ((int)local_a0 + 3 < (int)local_40);
          iVar3 = (int)local_60;
          uVar6 = local_88;
          uVar9 = local_40;
        }
        iVar2 = (int)uVar6;
        if ((int)uVar7 == iVar2) {
          if (local_a8 == 0) {
            if (local_90->nSize < (int)uVar9) {
LAB_00537e00:
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                            ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
            }
            uVar11 = local_90->pArray[uVar6];
          }
          else {
            uVar11 = (int)local_68 + iVar2;
          }
          uVar5 = (int)local_58 + iVar2;
          if ((int)(uVar11 | uVar5) < 0) {
LAB_00537e3e:
            __assert_fail("iVarA >= 0 && iVarB >= 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satSolver.h"
                          ,0x13f,"int sat_solver_add_buffer(sat_solver *, int, int, int)");
          }
          uVar5 = uVar5 * 2;
          local_b8 = uVar11 * 2 + 1;
          local_bc = uVar5;
          iVar2 = sat_solver_addclause(local_b0,(lit *)&local_bc,(lit *)&local_b4);
          uVar6 = local_88;
          if (iVar2 != 0) {
            local_b8 = uVar11 * 2;
            local_bc = uVar5 | 1;
            sat_solver_addclause(local_b0,(lit *)&local_bc,(lit *)&local_b4);
            uVar6 = local_88;
          }
        }
        uVar8 = local_a8 + 1;
        local_94 = local_94 + 1;
        local_80 = local_80 + uVar9;
        uVar10 = (ulong)(uint)(iVar3 + (int)uVar9);
      } while (uVar8 != uVar9);
    }
  }
  psVar1 = local_b0;
  if ((local_74 < 1) || (iVar3 = (int)uVar9, iVar3 <= local_74)) {
    __assert_fail("K > 0 && K < nBits",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bmc/bmcFault.c"
                  ,0xbe,"void Cnf_AddCardinConstrGeneral(sat_solver *, Vec_Int_t *, int, int)");
  }
  iVar3 = (int)local_70 + local_74 + (iVar3 + -1) * iVar3;
  if (iVar3 < 0) {
LAB_00537e5d:
    __assert_fail("Var >= 0 && !(c >> 1)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                  ,0xf1,"int Abc_Var2Lit(int, int)");
  }
  local_bc = iVar3 * 2 + 1;
  iVar2 = sat_solver_addclause(local_b0,(lit *)&local_bc,(lit *)&local_b8);
  if (iVar2 == 0) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bmc/bmcFault.c"
                  ,0xc1,"void Cnf_AddCardinConstrGeneral(sat_solver *, Vec_Int_t *, int, int)");
  }
  if (local_78 != 0) {
    if (iVar3 == 0) goto LAB_00537e5d;
    local_bc = iVar3 * 2 - 2;
    iVar3 = sat_solver_addclause(psVar1,(lit *)&local_bc,(lit *)&local_b8);
    if (iVar3 == 0) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bmc/bmcFault.c"
                    ,0xc6,"void Cnf_AddCardinConstrGeneral(sat_solver *, Vec_Int_t *, int, int)");
    }
  }
  return;
}

Assistant:

void Cnf_AddCardinConstrGeneral( sat_solver * p, Vec_Int_t * vVars, int K, int fStrict )
{
    int i, k, iCur, iNext, iVar, Lit;
    int nVars = sat_solver_nvars(p);
    int nBits = Vec_IntSize(vVars);
    Vec_IntForEachEntry( vVars, iVar, i )
        assert( iVar >= 0 && iVar < nVars );
    sat_solver_setnvars( p, nVars + nBits * nBits );
    for ( i = 0; i < nBits; i++ )
    {
        iCur = nVars + nBits * (i-1);
        iNext = nVars + nBits * i;
        if ( i & 1 )
            sat_solver_add_buffer( p, iNext, Cnf_AddCardinVar(i, iCur, vVars, 0), 0 );
        for ( k = i & 1; k + 1 < nBits; k += 2 )
        {
            sat_solver_add_and( p, iNext+k  , Cnf_AddCardinVar(i, iCur, vVars, k), Cnf_AddCardinVar(i, iCur, vVars, k+1), 1, 1, 1 );
            sat_solver_add_and( p, iNext+k+1, Cnf_AddCardinVar(i, iCur, vVars, k), Cnf_AddCardinVar(i, iCur, vVars, k+1), 0, 0, 0 );
        }
        if ( k == nBits - 1 )
            sat_solver_add_buffer( p, iNext + nBits-1, Cnf_AddCardinVar(i, iCur, vVars, nBits-1), 0 );
    }
    // add final constraint
    assert( K > 0 && K < nBits );
    Lit = Abc_Var2Lit( nVars + nBits * (nBits - 1) + K, 1 );
    if ( !sat_solver_addclause( p, &Lit, &Lit+1 ) )
        assert( 0 );
    if ( fStrict )
    {
        Lit = Abc_Var2Lit( nVars + nBits * (nBits - 1) + K - 1, 0 );
        if ( !sat_solver_addclause( p, &Lit, &Lit+1 ) )
            assert( 0 );
    }
}